

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefRepeatedEnum
          (ExtensionSet *this,int number,int index)

{
  Extension *pEVar1;
  const_reference piVar2;
  string *psVar3;
  LogMessageFatal *pLVar4;
  LogMessageFatal local_20 [16];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1ff,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (local_20,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_0013a6d7;
  }
  if (pEVar1->is_repeated == false) {
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (1,0,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                       );
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    if ((byte)(pEVar1->type - 0x13) < 0xee) {
      pLVar4 = local_20;
      GetRefRepeatedEnum();
LAB_0013a6a7:
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)pLVar4,8,
                          "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
    }
    else {
      pLVar4 = (LogMessageFatal *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
      if (pLVar4 != (LogMessageFatal *)0x8) goto LAB_0013a6a7;
      psVar3 = (string *)0x0;
    }
    if (psVar3 == (string *)0x0) {
      piVar2 = RepeatedField<int>::Get((RepeatedField<int> *)pEVar1->field_0,index);
      return piVar2;
    }
  }
  else {
    GetRefRepeatedEnum();
  }
  GetRefRepeatedEnum();
LAB_0013a6d7:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
}

Assistant:

const int& ExtensionSet::GetRefRepeatedEnum(int number, int index) const {
  const Extension* extension = FindOrNull(number);
  ABSL_CHECK(extension != nullptr) << "Index out-of-bounds (field is empty).";
  ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
  return extension->ptr.repeated_enum_value->Get(index);
}